

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::mulbaseappr(BN *this,bt *multiplier)

{
  iterator __position;
  ushort *puVar1;
  uint local_c;
  
  if (*multiplier == 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
    *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
  }
  else {
    puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    __position._M_current =
         (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (puVar1 == __position._M_current) {
      local_c = 0;
    }
    else {
      local_c = 0;
      do {
        local_c = (uint)*multiplier * (uint)*puVar1 + local_c;
        *puVar1 = (ushort)local_c;
        local_c = local_c >> 0x10;
        puVar1 = puVar1 + 1;
      } while (puVar1 != __position._M_current);
    }
    if (local_c != 0) {
      if (__position._M_current ==
          (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_realloc_insert<unsigned_int&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,__position,&local_c
                  );
      }
      else {
        *__position._M_current = (unsigned_short)local_c;
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  return this;
}

Assistant:

BN& BN::mulbaseappr(const bt &multiplier)
{
    if (!multiplier) {
        ba.resize(1);
        ba.front() = 0;
        return *this;
    }

    bt2 curr = 0;
    for(auto& i : ba) {
        i = curr += static_cast<bt2>(i) * multiplier;
        curr >>= bz8;
    }
    if (curr)
        ba.emplace_back(curr);
    return *this;
}